

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  uint uVar3;
  ZSTD_CDict *pZVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  undefined8 uVar6;
  bool bVar7;
  U32 offset;
  uint uVar8;
  ulong uVar9;
  seqDef *psVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  U32 UVar20;
  BYTE *pBVar21;
  uint uVar22;
  uint local_9c;
  uint local_98;
  uint local_90;
  U32 local_70 [3];
  size_t local_60;
  ulong local_58;
  long local_50;
  BYTE *litLimit_w;
  ZSTD_Sequence *local_40;
  ulong local_38;
  
  UVar20 = seqPos->posInSequence;
  local_50 = (long)src + blockSize;
  pZVar4 = cctx->cdict;
  if (pZVar4 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_60 = 0;
      goto LAB_00520cb5;
    }
    pZVar4 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_60 = pZVar4->dictContentSize;
LAB_00520cb5:
  local_98 = seqPos->idx;
  uVar17 = UVar20 + (int)blockSize;
  local_70 = *&((cctx->blockState).prevCBlock)->rep;
  litLimit_w = (BYTE *)(local_50 + -0x20);
  bVar7 = false;
  local_9c = 0;
  local_58 = blockSize;
  local_40 = inSeqs;
  local_38 = inSeqsSize;
  while (uVar13 = local_9c, uVar17 != 0) {
    uVar8 = uVar17;
    if ((bVar7) || (uVar9 = (ulong)local_98, local_38 <= uVar9)) goto LAB_00520fd2;
    uVar3 = local_40[uVar9].litLength;
    uVar16 = local_40[uVar9].matchLength;
    local_90 = uVar16 + uVar3;
    uVar14 = local_90 - uVar17;
    if (local_90 < uVar17 || uVar14 == 0) {
      iVar12 = UVar20 - uVar3;
      if (UVar20 < uVar3) {
        iVar12 = 0;
      }
      uVar16 = uVar16 - iVar12;
      bVar7 = false;
      uVar22 = uVar3 - UVar20;
      if (uVar3 < UVar20) {
        uVar22 = 0;
      }
      local_98 = local_98 + 1;
      UVar20 = 0;
    }
    else {
      uVar11 = uVar17 - uVar3;
      if (uVar17 < uVar3 || uVar11 == 0) goto LAB_00520fd2;
      uVar22 = uVar3 - UVar20;
      if (uVar3 < UVar20) {
        uVar22 = 0;
      }
      uVar13 = uVar11;
      uVar8 = uVar3;
      if (uVar16 <= local_58) goto LAB_00520fd2;
      uVar16 = (uVar17 - UVar20) - uVar22;
      uVar3 = (cctx->appliedParams).cParams.minMatch;
      if (uVar16 < uVar3) goto LAB_00520fd2;
      local_90 = uVar3 - uVar14;
      if (uVar3 >= uVar14 && local_90 != 0) {
        local_9c = local_90;
      }
      if (uVar3 < uVar14) {
        local_90 = 0;
      }
      uVar16 = uVar16 - local_90;
      bVar7 = true;
    }
    offset = ZSTD_finalizeOffCode(local_40[uVar9].offset,local_70,(uint)(uVar22 == 0));
    local_70 = (U32  [3])ZSTD_updateRep(local_70,offset,(uint)(uVar22 == 0));
    if ((cctx->appliedParams).validateSequences != 0) {
      uVar15 = (ulong)(uVar22 + uVar16) + seqPos->posInSrc;
      seqPos->posInSrc = uVar15;
      uVar18 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
      uVar9 = local_60 + uVar15;
      if (uVar18 < uVar15) {
        uVar9 = uVar18;
      }
      if ((uVar16 < (cctx->appliedParams).cParams.minMatch) || (uVar9 + 2 < (ulong)offset)) {
        return 0xffffffffffffffec;
      }
    }
    if ((cctx->seqStore).maxNbSeq < (ulong)(local_98 - seqPos->idx)) {
      return 0xffffffffffffffc0;
    }
    uVar9 = (ulong)uVar22;
    pBVar21 = (cctx->seqStore).lit;
    if (litLimit_w < (BYTE *)((long)src + uVar9)) {
      ZSTD_safecopyLiterals(pBVar21,(BYTE *)src,(BYTE *)((long)src + uVar9),litLimit_w);
LAB_00520ea7:
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar9;
      psVar10 = (cctx->seqStore).sequences;
      if (0xffff < uVar22) {
        (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
    }
    else {
      uVar6 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar21 = *src;
      *(undefined8 *)(pBVar21 + 8) = uVar6;
      if (0x10 < uVar22) {
        pBVar21 = (cctx->seqStore).lit;
        uVar6 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar21 + 0x18) = uVar6;
        if (0x10 < uVar9 - 0x10) {
          lVar19 = 0;
          do {
            uVar6 = *(undefined8 *)((BYTE *)((long)src + lVar19 + 0x20) + 8);
            pBVar2 = pBVar21 + lVar19 + 0x20;
            *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar19 + 0x20);
            *(undefined8 *)(pBVar2 + 8) = uVar6;
            uVar6 = *(undefined8 *)((BYTE *)((long)src + lVar19 + 0x30) + 8);
            *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)((long)src + lVar19 + 0x30);
            *(undefined8 *)(pBVar2 + 0x18) = uVar6;
            lVar19 = lVar19 + 0x20;
          } while (pBVar2 + 0x20 < pBVar21 + uVar9);
          goto LAB_00520ea7;
        }
      }
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar9;
      psVar10 = (cctx->seqStore).sequences;
    }
    psVar10->litLength = (U16)uVar22;
    psVar10->offset = offset + 1;
    if (0xffff < uVar16 - 3) {
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)psVar10 - (long)(cctx->seqStore).sequencesStart) >> 3);
    }
    uVar17 = uVar17 - local_90;
    psVar10->matchLength = (U16)(uVar16 - 3);
    (cctx->seqStore).sequences = psVar10 + 1;
    src = (void *)((long)src + (ulong)(uVar22 + uVar16));
  }
  uVar8 = 0;
LAB_00520fd2:
  seqPos->idx = local_98;
  seqPos->posInSequence = uVar8;
  pZVar5 = (cctx->blockState).nextCBlock;
  pZVar5->rep[2] = local_70[2];
  *(undefined8 *)pZVar5->rep = local_70._0_8_;
  pBVar21 = (BYTE *)(local_50 - (ulong)uVar13);
  if ((BYTE *)src != pBVar21) {
    uVar9 = (ulong)(uint)((int)pBVar21 - (int)src);
    memcpy((cctx->seqStore).lit,src,uVar9);
    ppBVar1 = &(cctx->seqStore).lit;
    *ppBVar1 = *ppBVar1 + uVar9;
    seqPos->posInSrc = seqPos->posInSrc + uVar9;
  }
  return (ulong)uVar13;
}

Assistant:

static size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                                       const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                                       const void* src, size_t blockSize) {
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;
    U32 litLength;
    U32 matchLength;
    U32 rawOffset;
    U32 offCode;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStore: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        litLength = currSeq.litLength;
        matchLength = currSeq.matchLength;
        rawOffset = currSeq.offset;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
            idx++;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 ll0 = (litLength == 0);
            offCode = ZSTD_finalizeOffCode(rawOffset, updatedRepcodes.rep, ll0);
            updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep, offCode, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offCode, matchLength, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize,
                                                   cctx->appliedParams.cParams.minMatch),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offCode, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx > cctx->seqStore.maxNbSeq, memory_allocation,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offCode, matchLength - MINMATCH);
        ip += matchLength + litLength;
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}